

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O2

void __thiscall OPLmusicFile::OPLmusicFile(OPLmusicFile *this,FileReader *reader)

{
  int *piVar1;
  OPLio *pOVar2;
  int iVar3;
  ushort uVar4;
  int iVar5;
  BYTE *pBVar6;
  undefined4 extraout_var;
  int *piVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int *piVar12;
  bool bVar13;
  
  OPLmusicBlock::OPLmusicBlock(&this->super_OPLmusicBlock);
  (this->super_OPLmusicBlock)._vptr_OPLmusicBlock = (_func_int **)&PTR__OPLmusicFile_006e9d78;
  iVar5 = (int)reader->Length;
  this->ScoreLen = iVar5;
  if ((this->super_OPLmusicBlock).super_musicBlock.io == (OPLio *)0x0) {
    return;
  }
  pBVar6 = (BYTE *)operator_new__((long)iVar5);
  (this->super_OPLmusicBlock).super_musicBlock.scoredata = pBVar6;
  iVar5 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])(reader,pBVar6,(long)iVar5);
  if (CONCAT44(extraout_var,iVar5) == (long)this->ScoreLen) {
    pOVar2 = (this->super_OPLmusicBlock).super_musicBlock.io;
    iVar5 = (*pOVar2->_vptr_OPLio[2])(pOVar2,(ulong)(uint)(this->super_OPLmusicBlock).NumChips,0,0);
    (this->super_OPLmusicBlock).NumChips = iVar5;
    if (iVar5 == 0) goto LAB_003540cb;
    piVar12 = (int *)(this->super_OPLmusicBlock).super_musicBlock.scoredata;
    iVar5 = *piVar12;
    if (iVar5 == 0x41524244) {
      if (piVar12[1] == 0x4c504f57) {
        if (*(short *)((long)piVar12 + 10) == 1) {
          this->RawPlayer = DosBox1;
          (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
          iVar5 = this->ScoreLen + -0x18;
          if (piVar12[4] <= iVar5) {
            iVar5 = piVar12[4];
          }
          iVar5 = iVar5 + 0x18;
LAB_00354024:
          this->ScoreLen = iVar5;
LAB_0035402a:
          (*(this->super_OPLmusicBlock)._vptr_OPLmusicBlock[2])(this);
          return;
        }
        if (piVar12[2] == 2) {
          if (*(char *)((long)piVar12 + 0x15) == '\0') {
            uVar11 = 0;
            if (*(char *)((long)piVar12 + 0x16) == '\0') {
              this->RawPlayer = DosBox2;
              (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
              iVar10 = this->ScoreLen - (*(byte *)((long)piVar12 + 0x19) + 0x1a);
              iVar5 = piVar12[3] * 2;
              if (iVar10 < piVar12[3] * 2) {
                iVar5 = iVar10;
              }
              iVar5 = (uint)*(byte *)((long)piVar12 + 0x19) + iVar5 + 0x1a;
              goto LAB_00354024;
            }
          }
          else {
            Printf("Unsupported DOSBox Raw OPL format %d\n",(ulong)*(byte *)(piVar12 + 5));
            piVar12 = (int *)(this->super_OPLmusicBlock).super_musicBlock.scoredata;
            if (*(char *)((long)piVar12 + 0x16) == '\0') goto LAB_003540d4;
            uVar11 = (ulong)*(byte *)((long)piVar12 + 0x15);
          }
          Printf("Unsupported DOSBox Raw OPL compression %d\n",uVar11);
        }
        else {
          Printf("Unsupported DOSBox Raw OPL version %d.%d\n",(ulong)(piVar12[2] & 0xffff));
        }
      }
      goto LAB_003540cb;
    }
    if (iVar5 == 0x494c4441) {
      if (((char)piVar12[1] != 'B') || (*(char *)((long)piVar12 + 5) != '\x01')) goto LAB_003540cb;
      iVar5 = this->ScoreLen;
      piVar1 = (int *)((long)piVar12 + (long)iVar5);
      this->RawPlayer = IMF;
      (this->super_OPLmusicBlock).SamplesPerTick = 71.02285714285715;
      (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)((long)piVar12 + 6);
      iVar10 = 2;
      piVar8 = (int *)((long)piVar12 + 6);
LAB_00353fbb:
      bVar13 = iVar10 != 0;
      iVar10 = iVar10 + -1;
      piVar7 = piVar8;
      if (bVar13) {
        do {
          piVar8 = piVar7;
          if (piVar1 <= piVar7) break;
          piVar8 = (int *)((long)piVar7 + 1);
          (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)piVar8;
          iVar3 = *piVar7;
          piVar7 = piVar8;
        } while ((char)iVar3 != '\0');
        goto LAB_00353fbb;
      }
      if (piVar8 < piVar1) {
        piVar8 = (int *)((long)piVar8 + 1);
        (this->super_OPLmusicBlock).super_musicBlock.score = (BYTE *)piVar8;
      }
      if (piVar8 + 2 <= piVar1) {
        if ((long)*piVar8 != 0) {
          lVar9 = (long)*piVar8 + 4;
          if (lVar9 < (long)iVar5 - ((long)piVar8 - (long)piVar12)) {
            this->ScoreLen = (int)((long)piVar8 - (long)piVar12) + (int)lVar9;
          }
        }
        goto LAB_0035402a;
      }
    }
    else if (iVar5 == 0x41574152) {
      if (piVar12[1] == 0x41544144) {
        this->RawPlayer = RDosPlay;
        uVar4 = *(ushort *)(piVar12 + 2);
        if (uVar4 == 0) {
          *(undefined2 *)(piVar12 + 2) = 0xffff;
          uVar4 = 0xffff;
        }
        (this->super_OPLmusicBlock).SamplesPerTick = (double)uVar4 * 0.041666666666666664;
        goto LAB_0035402a;
      }
      goto LAB_003540cb;
    }
  }
  else {
LAB_003540cb:
    piVar12 = (int *)(this->super_OPLmusicBlock).super_musicBlock.scoredata;
    if (piVar12 == (int *)0x0) goto LAB_003540d9;
  }
LAB_003540d4:
  operator_delete__(piVar12);
LAB_003540d9:
  (this->super_OPLmusicBlock).super_musicBlock.scoredata = (BYTE *)0x0;
  return;
}

Assistant:

OPLmusicFile::OPLmusicFile (FileReader *reader)
	: ScoreLen (reader->GetLength())
{
	if (io == NULL)
	{
		return;
	}

	scoredata = new BYTE[ScoreLen];

    if (reader->Read(scoredata, ScoreLen) != ScoreLen)
    {
fail:	delete[] scoredata;
        scoredata = NULL;
        return;
    }

	if (0 == (NumChips = io->OPLinit(NumChips)))
	{
		goto fail;
	}

	// Check for RDosPlay raw OPL format
	if (((DWORD *)scoredata)[0] == MAKE_ID('R','A','W','A') &&
			 ((DWORD *)scoredata)[1] == MAKE_ID('D','A','T','A'))
	{
		RawPlayer = RDosPlay;
		if (*(WORD *)(scoredata + 8) == 0)
		{ // A clock speed of 0 is bad
			*(WORD *)(scoredata + 8) = 0xFFFF; 
		}
		SamplesPerTick = LittleShort(*(WORD *)(scoredata + 8)) / ADLIB_CLOCK_MUL;
	}
	// Check for DosBox OPL dump
	else if (((DWORD *)scoredata)[0] == MAKE_ID('D','B','R','A') &&
		((DWORD *)scoredata)[1] == MAKE_ID('W','O','P','L'))
	{
		if (LittleShort(((WORD *)scoredata)[5]) == 1)
		{
			RawPlayer = DosBox1;
			SamplesPerTick = OPL_SAMPLE_RATE / 1000;
			ScoreLen = MIN<int>(ScoreLen - 24, LittleLong(((DWORD *)scoredata)[4])) + 24;
		}
		else if (((DWORD *)scoredata)[2] == MAKE_ID(2,0,0,0))
		{
			bool okay = true;
			if (scoredata[21] != 0)
			{
				Printf("Unsupported DOSBox Raw OPL format %d\n", scoredata[20]);
				okay = false;
			}
			if (scoredata[22] != 0)
			{
				Printf("Unsupported DOSBox Raw OPL compression %d\n", scoredata[21]);
				okay = false;
			}
			if (!okay)
				goto fail;
			RawPlayer = DosBox2;
			SamplesPerTick = OPL_SAMPLE_RATE / 1000;
			int headersize = 0x1A + scoredata[0x19];
			ScoreLen = MIN<int>(ScoreLen - headersize, LittleLong(((DWORD *)scoredata)[3]) * 2) + headersize;
		}
		else
		{
			Printf("Unsupported DOSBox Raw OPL version %d.%d\n", LittleShort(((WORD *)scoredata)[4]), LittleShort(((WORD *)scoredata)[5]));
			goto fail;
		}
	}
	// Check for modified IMF format (includes a header)
	else if (((DWORD *)scoredata)[0] == MAKE_ID('A','D','L','I') &&
		     scoredata[4] == 'B' && scoredata[5] == 1)
	{
		int songlen;
		BYTE *max = scoredata + ScoreLen;
		RawPlayer = IMF;
		SamplesPerTick = OPL_SAMPLE_RATE / IMF_RATE;

		score = scoredata + 6;
		// Skip track and game name
		for (int i = 2; i != 0; --i)
		{
			while (score < max && *score++ != '\0') {}
		}
		if (score < max) score++;	// Skip unknown byte
		if (score + 8 > max)
		{ // Not enough room left for song data
			delete[] scoredata;
			scoredata = NULL;
			return;
		}
		songlen = LittleLong(*(DWORD *)score);
		if (songlen != 0 && (songlen +=4) < ScoreLen - (score - scoredata))
		{
			ScoreLen = songlen + int(score - scoredata);
		}
	}
	else
	{
		goto fail;
	}

	Restart ();
}